

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-util.c
# Opt level: O0

_Bool suffix(char *s,char *t)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  size_t slen;
  size_t tlen;
  char *t_local;
  char *s_local;
  
  sVar2 = strlen(t);
  sVar3 = strlen(s);
  if (sVar3 < sVar2) {
    s_local._7_1_ = false;
  }
  else {
    iVar1 = strcmp(s + (sVar3 - sVar2),t);
    s_local._7_1_ = iVar1 == 0;
  }
  return s_local._7_1_;
}

Assistant:

bool suffix(const char *s, const char *t)
{
	size_t tlen = strlen(t);
	size_t slen = strlen(s);

	/* Check for incompatible lengths */
	if (tlen > slen) return (false);

	/* Compare "t" to the end of "s" */
	return (!strcmp(s + slen - tlen, t));
}